

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall
Json::BuiltStyledStreamWriter::writeArrayValue(BuiltStyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  byte bVar4;
  ArrayIndex AVar5;
  undefined4 extraout_var;
  Value *root;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  allocator<char> local_61;
  ulong local_60;
  Value *local_58;
  String local_50;
  
  local_58 = value;
  AVar5 = Value::size(value);
  local_60 = CONCAT44(extraout_var,AVar5);
  if (AVar5 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"[]",&local_61);
    pushValue(this,&local_50);
  }
  else {
    if (this->cs_ != All) {
      bVar3 = isMultilineArray(this,local_58);
      if (!bVar3) {
        uVar7 = (long)(this->childValues_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->childValues_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (uVar7 == (local_60 & 0xffffffff)) {
          std::operator<<((this->super_StreamWriter).sout_,"[");
          if ((this->indentation_)._M_string_length != 0) {
            std::operator<<((this->super_StreamWriter).sout_," ");
          }
          lVar8 = 0;
          while (bVar3 = uVar7 != 0, uVar7 = uVar7 - 1, bVar3) {
            if (lVar8 != 0) {
              pcVar6 = ", ";
              if ((this->indentation_)._M_string_length == 0) {
                pcVar6 = ",";
              }
              std::operator<<((this->super_StreamWriter).sout_,pcVar6);
            }
            std::operator<<((this->super_StreamWriter).sout_,
                            (string *)
                            ((long)&(((this->childValues_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar8));
            lVar8 = lVar8 + 0x20;
          }
          if ((this->indentation_)._M_string_length != 0) {
            std::operator<<((this->super_StreamWriter).sout_," ");
          }
          std::operator<<((this->super_StreamWriter).sout_,"]");
          return;
        }
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/springkim[P]cip/src/jsoncpp.cpp"
                      ,0x13d3,"void Json::BuiltStyledStreamWriter::writeArrayValue(const Value &)");
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"[",&local_61);
    writeWithIndent(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    indent(this);
    pbVar1 = (this->childValues_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->childValues_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_60 = (ulong)((int)local_60 - 1);
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      root = Value::operator[](local_58,(ArrayIndex)uVar7);
      writeCommentBeforeValue(this,root);
      if (pbVar1 == pbVar2) {
        bVar4 = this->field_0xd8;
        if ((bVar4 & 2) == 0) {
          writeIndent(this);
          bVar4 = this->field_0xd8;
        }
        this->field_0xd8 = bVar4 | 2;
        writeValue(this,root);
        this->field_0xd8 = this->field_0xd8 & 0xfd;
      }
      else {
        writeWithIndent(this,(String *)
                             ((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8));
      }
      if (local_60 == uVar7) break;
      uVar7 = uVar7 + 1;
      std::operator<<((this->super_StreamWriter).sout_,",");
      writeCommentAfterValueOnSameLine(this,root);
      lVar8 = lVar8 + 0x20;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"]",&local_61);
    writeWithIndent(this,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeArrayValue(Value const& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isMultiLine = (cs_ == CommentStyle::All) || isMultilineArray(value);
    if (isMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        Value const& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_)
            writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *sout_ << "[";
      if (!indentation_.empty())
        *sout_ << " ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *sout_ << ((!indentation_.empty()) ? ", " : ",");
        *sout_ << childValues_[index];
      }
      if (!indentation_.empty())
        *sout_ << " ";
      *sout_ << "]";
    }
  }
}